

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec_extras.h
# Opt level: O0

double Dot<double>(TPZVec<double> *x1,TPZVec<double> *x2)

{
  double dVar1;
  int64_t iVar2;
  double *pdVar3;
  TPZVec<double> *in_RSI;
  TPZVec<double> *in_RDI;
  int i;
  int size;
  double result;
  undefined4 local_20;
  undefined8 local_18;
  
  local_18 = 0.0;
  iVar2 = TPZVec<double>::NElements(in_RDI);
  for (local_20 = 0; local_20 < (int)iVar2; local_20 = local_20 + 1) {
    pdVar3 = TPZVec<double>::operator[](in_RDI,(long)local_20);
    dVar1 = *pdVar3;
    pdVar3 = TPZVec<double>::operator[](in_RSI,(long)local_20);
    local_18 = dVar1 * *pdVar3 + local_18;
  }
  return local_18;
}

Assistant:

T Dot(const TPZVec <T> &x1, const TPZVec<T> &x2) {
    T result = T(0.);
    int size = x1.NElements();

#ifdef PZDEBUG
    if (size != x2.NElements()) {
        PZError << "Dot error!" << std::endl
                << "Vectors with different sizes #x1 = " << size
                << ", #x2 = " << x2.NElements() << std::endl;

        PZError.flush();
    }
#endif

    for (int i = 0; i < size; ++i) {
        result = result + x1[i] * x2[i];
    }
    return result;
}